

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O2

string * basisu::string_format_abi_cxx11_(string *__return_storage_ptr__,char *pFmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buf [2048];
  allocator<char> local_8e9;
  undefined8 local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 local_8b0;
  undefined8 local_8a8;
  undefined8 local_8a0;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined8 local_848;
  undefined8 local_838;
  undefined8 local_828;
  char local_818 [2056];
  
  local_8d8 = local_8c8;
  if (in_AL != '\0') {
    local_898 = in_XMM0_Qa;
    local_888 = in_XMM1_Qa;
    local_878 = in_XMM2_Qa;
    local_868 = in_XMM3_Qa;
    local_858 = in_XMM4_Qa;
    local_848 = in_XMM5_Qa;
    local_838 = in_XMM6_Qa;
    local_828 = in_XMM7_Qa;
  }
  local_8e0 = &stack0x00000008;
  local_8e8 = 0x3000000010;
  local_8b8 = in_RDX;
  local_8b0 = in_RCX;
  local_8a8 = in_R8;
  local_8a0 = in_R9;
  vsnprintf(local_818,0x800,pFmt,&local_8e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_818,&local_8e9);
  return __return_storage_ptr__;
}

Assistant:

inline std::string string_format(const char* pFmt, ...)
	{
		char buf[2048];

		va_list args;
		va_start(args, pFmt);
#ifdef _WIN32		
		vsprintf_s(buf, sizeof(buf), pFmt, args);
#else
		vsnprintf(buf, sizeof(buf), pFmt, args);
#endif		
		va_end(args);

		return std::string(buf);
	}